

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O3

void Scl_LibertyWipeOutComments(char *pBeg,char *pEnd)

{
  char *pcVar1;
  char *pcVar2;
  size_t __n;
  long lVar3;
  char *pcVar4;
  
  pcVar1 = pEnd + -1;
  if (pBeg < pcVar1) {
    do {
      pcVar4 = pBeg;
      if (*pBeg == '/') {
        if (pBeg[1] == '*') {
          pcVar4 = pBeg;
          if (pBeg < pcVar1) {
            lVar3 = 1;
            pcVar2 = (char *)0x0;
            do {
              if ((pBeg[lVar3 + -1] == '*') && (pBeg[lVar3] == '/')) {
                pcVar4 = pBeg + -(long)pcVar2;
                if (pBeg < pBeg + (2 - (long)pcVar2)) {
                  lVar3 = -2;
                  do {
                    if (pBeg[lVar3 + 2] != '\n') {
                      pBeg[lVar3 + 2] = ' ';
                    }
                    lVar3 = lVar3 + 1;
                  } while (pcVar2 + lVar3 != (char *)0x0);
                }
                break;
              }
              pcVar2 = pcVar2 + -1;
              lVar3 = lVar3 + 1;
              pcVar4 = pcVar1;
            } while (pBeg + (1 - (long)pEnd) != pcVar2);
          }
        }
        else {
          pcVar4 = pBeg;
          if (pBeg < pEnd && pBeg[1] == '/') {
            __n = 0;
            do {
              pcVar4 = pBeg + __n;
              if ((pcVar4 == pcVar1) || (pBeg[__n] == '\n')) {
                if (pBeg < pcVar4) {
                  memset(pBeg,0x20,__n);
                }
                break;
              }
              __n = __n + 1;
              pcVar4 = pEnd;
            } while ((long)pEnd - (long)pBeg != __n);
          }
        }
      }
      pBeg = pcVar4 + 1;
    } while (pBeg < pcVar1);
  }
  return;
}

Assistant:

void Scl_LibertyWipeOutComments( char * pBeg, char * pEnd )
{
    char * pCur, * pStart;
    for ( pCur = pBeg; pCur < pEnd-1; pCur++ )
        if ( pCur[0] == '/' && pCur[1] == '*' )
        {
            for ( pStart = pCur; pCur < pEnd-1; pCur++ )
                if ( pCur[0] == '*' && pCur[1] == '/' )
                {
                    for ( ; pStart < pCur + 2; pStart++ )
                    if ( *pStart != '\n' ) *pStart = ' ';
                    break;
                }
        }
        else if ( pCur[0] == '/' && pCur[1] == '/' )
        {
            for ( pStart = pCur; pCur < pEnd; pCur++ )
                if ( pCur[0] == '\n' || pCur == pEnd-1 )
                {
                    for ( ; pStart < pCur; pStart++ ) *pStart = ' ';
                    break;
                }
        }
}